

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O0

void duckdb::BitStringAggOperation::
     Operation<unsigned_char,duckdb::BitAggState<unsigned_char>,duckdb::BitStringAggOperation>
               (BitAggState<unsigned_char> *state,uchar *input,AggregateUnaryInput *unary_input)

{
  bool bVar1;
  byte bVar2;
  uint len_00;
  BinderException *this;
  undefined8 uVar3;
  char *data;
  string_t *this_00;
  byte *in_RSI;
  byte *in_RDI;
  string_t target;
  idx_t len;
  idx_t bit_range;
  BitstringAggBindData *bind_agg_data;
  undefined8 in_stack_fffffffffffffd98;
  uchar uVar4;
  BitAggState<unsigned_char> *in_stack_fffffffffffffda0;
  allocator *paVar5;
  uint32_t in_stack_fffffffffffffdb4;
  undefined8 in_stack_fffffffffffffde8;
  undefined2 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  InvalidInputException *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  OutOfRangeException *in_stack_fffffffffffffe70;
  anon_union_16_2_67f50693_for_value local_158;
  char *local_148;
  undefined1 local_139;
  allocator local_f1;
  string local_f0 [32];
  idx_t local_d0;
  undefined1 local_c1;
  allocator local_79;
  string local_78 [35];
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  BitstringAggBindData *local_20;
  byte *local_10;
  byte *local_8;
  
  uVar6 = (undefined2)((ulong)in_stack_fffffffffffffde8 >> 0x30);
  local_10 = in_RSI;
  local_8 = in_RDI;
  optional_ptr<duckdb::FunctionData,_true>::operator->
            ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_fffffffffffffda0);
  local_20 = FunctionData::Cast<duckdb::BitstringAggBindData>
                       ((FunctionData *)in_stack_fffffffffffffda0);
  uVar4 = (uchar)((ulong)in_stack_fffffffffffffd98 >> 0x38);
  if ((*local_8 & 1) != 0) {
LAB_009a1aa7:
    if ((local_8[0x18] <= *local_10) && (*local_10 <= local_8[0x19])) {
      duckdb::Value::GetValue<unsigned_char>();
      Execute<unsigned_char,duckdb::BitAggState<unsigned_char>>
                (in_stack_fffffffffffffda0,uVar4,(uchar)((ulong)in_stack_fffffffffffffd98 >> 0x30));
      return;
    }
    uVar3 = __cxa_allocate_exception(0x10);
    paVar5 = (allocator *)&stack0xfffffffffffffe6f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffe70,
               "Value %s is outside of provided min and max range (%s <-> %s)",paVar5);
    uVar4 = (uchar)((ulong)uVar3 >> 0x38);
    NumericHelper::ToString<unsigned_char>(uVar4);
    NumericHelper::ToString<unsigned_char>(uVar4);
    NumericHelper::ToString<unsigned_char>(uVar4);
    OutOfRangeException::
    OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
               in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    __cxa_throw(uVar3,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  bVar1 = Value::IsNull(&local_20->min);
  if (!bVar1) {
    bVar1 = Value::IsNull(&local_20->max);
    if (!bVar1) {
      bVar2 = duckdb::Value::GetValue<unsigned_char>();
      local_8[0x18] = bVar2;
      bVar2 = duckdb::Value::GetValue<unsigned_char>();
      local_8[0x19] = bVar2;
      if (local_8[0x19] < local_8[0x18]) {
        local_c1 = 1;
        uVar3 = __cxa_allocate_exception(0x10);
        paVar5 = &local_79;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_78,"Invalid explicit bitstring range: Minimum (%s) > maximum (%s)",paVar5);
        NumericHelper::ToString<unsigned_char>(uVar4);
        NumericHelper::ToString<unsigned_char>(uVar4);
        InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                   in_stack_fffffffffffffe28);
        local_c1 = 0;
        __cxa_throw(uVar3,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
      duckdb::Value::GetValue<unsigned_char>();
      duckdb::Value::GetValue<unsigned_char>();
      local_d0 = GetRange<unsigned_char>((uchar)((ushort)uVar6 >> 8),(uchar)uVar6);
      if (1000000000 < local_d0) {
        local_139 = 1;
        uVar3 = __cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_f0,
                   "The range between min and max value (%s <-> %s) is too large for bitstring aggregation"
                   ,&local_f1);
        NumericHelper::ToString<unsigned_char>(uVar4);
        NumericHelper::ToString<unsigned_char>(uVar4);
        OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                  ((OutOfRangeException *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                   in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        local_139 = 0;
        __cxa_throw(uVar3,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
      }
      data = (char *)duckdb::Bit::ComputeBitstringLen(local_d0);
      local_148 = data;
      if (data < (char *)0xd) {
        len_00 = UnsafeNumericCast<unsigned_int,unsigned_long,void>((unsigned_long)data);
        string_t::string_t((string_t *)&local_158.pointer,len_00);
      }
      else {
        this_00 = (string_t *)operator_new__((ulong)data);
        UnsafeNumericCast<unsigned_int,unsigned_long,void>((unsigned_long)local_148);
        string_t::string_t(this_00,data,in_stack_fffffffffffffdb4);
      }
      duckdb::Bit::SetEmptyBitString((string_t *)&local_158.pointer,local_d0);
      *(undefined8 *)(local_8 + 8) = local_158._0_8_;
      *(char **)(local_8 + 0x10) = local_158.pointer.ptr;
      *local_8 = 1;
      goto LAB_009a1aa7;
    }
  }
  local_55 = 1;
  this = (BinderException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,
             "Could not retrieve required statistics. Alternatively, try by providing the statistics explicitly: BITSTRING_AGG(col, min, max) "
             ,&local_41);
  duckdb::BinderException::BinderException(this,local_40);
  local_55 = 0;
  __cxa_throw(this,&BinderException::typeinfo,BinderException::~BinderException);
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		auto &bind_agg_data = unary_input.input.bind_data->template Cast<BitstringAggBindData>();
		if (!state.is_set) {
			if (bind_agg_data.min.IsNull() || bind_agg_data.max.IsNull()) {
				throw BinderException(
				    "Could not retrieve required statistics. Alternatively, try by providing the statistics "
				    "explicitly: BITSTRING_AGG(col, min, max) ");
			}
			state.min = bind_agg_data.min.GetValue<INPUT_TYPE>();
			state.max = bind_agg_data.max.GetValue<INPUT_TYPE>();
			if (state.min > state.max) {
				throw InvalidInputException("Invalid explicit bitstring range: Minimum (%s) > maximum (%s)",
				                            NumericHelper::ToString(state.min), NumericHelper::ToString(state.max));
			}
			idx_t bit_range =
			    GetRange(bind_agg_data.min.GetValue<INPUT_TYPE>(), bind_agg_data.max.GetValue<INPUT_TYPE>());
			if (bit_range > MAX_BIT_RANGE) {
				throw OutOfRangeException(
				    "The range between min and max value (%s <-> %s) is too large for bitstring aggregation",
				    NumericHelper::ToString(state.min), NumericHelper::ToString(state.max));
			}
			idx_t len = Bit::ComputeBitstringLen(bit_range);
			auto target = len > string_t::INLINE_LENGTH ? string_t(new char[len], UnsafeNumericCast<uint32_t>(len))
			                                            : string_t(UnsafeNumericCast<uint32_t>(len));
			Bit::SetEmptyBitString(target, bit_range);

			state.value = target;
			state.is_set = true;
		}
		if (input >= state.min && input <= state.max) {
			Execute(state, input, bind_agg_data.min.GetValue<INPUT_TYPE>());
		} else {
			throw OutOfRangeException("Value %s is outside of provided min and max range (%s <-> %s)",
			                          NumericHelper::ToString(input), NumericHelper::ToString(state.min),
			                          NumericHelper::ToString(state.max));
		}
	}